

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_proc_topology(Integer g_a,Integer proc,Integer *subscript)

{
  short sVar1;
  long lVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char err_string_1 [256];
  char err_string [256];
  Integer ga_handle;
  Integer ndim;
  Integer index;
  Integer d;
  char acStackY_238 [256];
  char local_138 [160];
  Integer in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  long local_28;
  long local_20;
  
  lVar2 = in_RDI + 1000;
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_138,"%s: INVALID ARRAY HANDLE","nga_proc_topology");
    pnga_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  if (GA[in_RDI + 1000].actv == 0) {
    sprintf(acStackY_238,"%s: ARRAY NOT ACTIVE","nga_proc_topology");
    pnga_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  sVar1 = GA[lVar2].ndim;
  local_28 = in_RSI;
  for (local_20 = 0; local_20 < sVar1; local_20 = local_20 + 1) {
    *(long *)(in_RDX + local_20 * 8) = local_28 % (long)GA[lVar2].nblock[local_20];
    local_28 = local_28 / (long)GA[lVar2].nblock[local_20];
  }
  return;
}

Assistant:

void pnga_proc_topology(Integer g_a, Integer proc, Integer* subscript)
{
Integer d, index, ndim, ga_handle = GA_OFFSET + g_a;

   ga_check_handleM(g_a, "nga_proc_topology");
   ndim = GA[ga_handle].ndim;

   index = proc;

   for(d=0; d<ndim; d++){
       subscript[d] = index% GA[ga_handle].nblock[d];
       index  /= GA[ga_handle].nblock[d];  
   }
}